

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

void __thiscall
el::base::TypedConfigurations::TypedConfigurations
          (TypedConfigurations *this,Configurations *configurations,
          LogStreamsReferenceMap *logStreamsReference)

{
  (this->super_ThreadSafe)._vptr_ThreadSafe = (_func_int **)&PTR_acquireLock_0012c5d8;
  (this->m_enabledMap)._M_h._M_buckets = &(this->m_enabledMap)._M_h._M_single_bucket;
  (this->m_enabledMap)._M_h._M_bucket_count = 1;
  (this->m_enabledMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_enabledMap)._M_h._M_element_count = 0;
  (this->m_enabledMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_enabledMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_enabledMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_toFileMap)._M_h._M_buckets = &(this->m_toFileMap)._M_h._M_single_bucket;
  (this->m_toFileMap)._M_h._M_bucket_count = 1;
  (this->m_toFileMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_toFileMap)._M_h._M_element_count = 0;
  (this->m_toFileMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_toFileMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_toFileMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_filenameMap)._M_h._M_buckets = &(this->m_filenameMap)._M_h._M_single_bucket;
  (this->m_filenameMap)._M_h._M_bucket_count = 1;
  (this->m_filenameMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_filenameMap)._M_h._M_element_count = 0;
  (this->m_filenameMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_filenameMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_filenameMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_toStandardOutputMap)._M_h._M_buckets =
       &(this->m_toStandardOutputMap)._M_h._M_single_bucket;
  (this->m_toStandardOutputMap)._M_h._M_bucket_count = 1;
  (this->m_toStandardOutputMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_toStandardOutputMap)._M_h._M_element_count = 0;
  (this->m_toStandardOutputMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_toStandardOutputMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_toStandardOutputMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_logFormatMap)._M_h._M_buckets = &(this->m_logFormatMap)._M_h._M_single_bucket;
  (this->m_logFormatMap)._M_h._M_bucket_count = 1;
  (this->m_logFormatMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_logFormatMap)._M_h._M_element_count = 0;
  (this->m_logFormatMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_logFormatMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_logFormatMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_subsecondPrecisionMap)._M_h._M_buckets =
       &(this->m_subsecondPrecisionMap)._M_h._M_single_bucket;
  (this->m_subsecondPrecisionMap)._M_h._M_bucket_count = 1;
  (this->m_subsecondPrecisionMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_subsecondPrecisionMap)._M_h._M_element_count = 0;
  (this->m_subsecondPrecisionMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_subsecondPrecisionMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_subsecondPrecisionMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_performanceTrackingMap)._M_h._M_buckets =
       &(this->m_performanceTrackingMap)._M_h._M_single_bucket;
  (this->m_performanceTrackingMap)._M_h._M_bucket_count = 1;
  (this->m_performanceTrackingMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_performanceTrackingMap)._M_h._M_element_count = 0;
  (this->m_performanceTrackingMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_performanceTrackingMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_performanceTrackingMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_fileStreamMap)._M_h._M_buckets = &(this->m_fileStreamMap)._M_h._M_single_bucket;
  (this->m_fileStreamMap)._M_h._M_bucket_count = 1;
  (this->m_fileStreamMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_fileStreamMap)._M_h._M_element_count = 0;
  (this->m_fileStreamMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_fileStreamMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_fileStreamMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_maxLogFileSizeMap)._M_h._M_buckets = &(this->m_maxLogFileSizeMap)._M_h._M_single_bucket;
  (this->m_maxLogFileSizeMap)._M_h._M_bucket_count = 1;
  (this->m_maxLogFileSizeMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_maxLogFileSizeMap)._M_h._M_element_count = 0;
  (this->m_maxLogFileSizeMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_maxLogFileSizeMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_maxLogFileSizeMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_logFlushThresholdMap)._M_h._M_buckets =
       &(this->m_logFlushThresholdMap)._M_h._M_single_bucket;
  (this->m_logFlushThresholdMap)._M_h._M_bucket_count = 1;
  (this->m_logFlushThresholdMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_logFlushThresholdMap)._M_h._M_element_count = 0;
  (this->m_logFlushThresholdMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_logFlushThresholdMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_logFlushThresholdMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->m_configurations = configurations;
  this->m_logStreamsReference = logStreamsReference;
  build(this,configurations);
  return;
}

Assistant:

TypedConfigurations::TypedConfigurations(Configurations* configurations,
    base::LogStreamsReferenceMap* logStreamsReference) {
  m_configurations = configurations;
  m_logStreamsReference = logStreamsReference;
  build(m_configurations);
}